

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_stats.c
# Opt level: O0

int main(void)

{
  flexfloat_desc_t desc;
  flexfloat_desc_t desc_00;
  flexfloat_desc_t desc_01;
  flexfloat_desc_t desc_02;
  flexfloat_desc_t desc_03;
  flexfloat_t n4;
  flexfloat_t n3;
  flexfloat_t n2;
  flexfloat_t n1;
  flexfloat_t ff_c;
  flexfloat_t ff_b;
  flexfloat_t ff_a;
  double dbl;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff71;
  undefined1 in_stack_ffffffffffffff72;
  undefined1 uVar1;
  undefined1 in_stack_ffffffffffffff73;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 uVar4;
  uint8_t in_stack_ffffffffffffff76;
  uint8_t uVar5;
  uint8_t in_stack_ffffffffffffff77;
  uint8_t uVar6;
  flexfloat_t local_78 [3];
  undefined2 local_46;
  undefined1 local_44;
  undefined1 uStack_43;
  undefined1 local_42;
  undefined1 uStack_41;
  flexfloat_t local_40 [3];
  undefined4 local_4;
  
  local_4 = 0;
  printf(
        "WARNING: Collection of statistics is not enabled by default, execute \"cd <build_dir> && cmake -DENABLE_STATS=ON <src_dir> && make\"\n"
        );
  local_42 = 0xb;
  uStack_41 = 0x34;
  desc.frac_bits = in_stack_ffffffffffffff77;
  desc.exp_bits = in_stack_ffffffffffffff76;
  ff_init_double((flexfloat_t *)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                 5.22366220100679e-318,desc);
  local_44 = 0xb;
  uStack_43 = 0x34;
  desc_00.frac_bits = in_stack_ffffffffffffff77;
  desc_00.exp_bits = in_stack_ffffffffffffff76;
  ff_init_double((flexfloat_t *)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                 5.22382524266992e-318,desc_00);
  local_46 = 0x340b;
  ff_init(local_40,(flexfloat_desc_t)0x340b);
  ff_add((flexfloat_t *)
         CONCAT17(in_stack_ffffffffffffff77,
                  CONCAT16(in_stack_ffffffffffffff76,
                           CONCAT15(in_stack_ffffffffffffff75,
                                    CONCAT14(in_stack_ffffffffffffff74,
                                             CONCAT13(in_stack_ffffffffffffff73,
                                                      CONCAT12(in_stack_ffffffffffffff72,
                                                               CONCAT11(in_stack_ffffffffffffff71,
                                                                        in_stack_ffffffffffffff70)))
                                            )))),
         (flexfloat_t *)
         CONCAT17(in_stack_ffffffffffffff6f,
                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
         (flexfloat_t *)0x10224f);
  ff_add((flexfloat_t *)
         CONCAT17(in_stack_ffffffffffffff77,
                  CONCAT16(in_stack_ffffffffffffff76,
                           CONCAT15(in_stack_ffffffffffffff75,
                                    CONCAT14(in_stack_ffffffffffffff74,
                                             CONCAT13(in_stack_ffffffffffffff73,
                                                      CONCAT12(in_stack_ffffffffffffff72,
                                                               CONCAT11(in_stack_ffffffffffffff71,
                                                                        in_stack_ffffffffffffff70)))
                                            )))),
         (flexfloat_t *)
         CONCAT17(in_stack_ffffffffffffff6f,
                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
         (flexfloat_t *)0x102261);
  ff_sub((flexfloat_t *)
         CONCAT17(in_stack_ffffffffffffff77,
                  CONCAT16(in_stack_ffffffffffffff76,
                           CONCAT15(in_stack_ffffffffffffff75,
                                    CONCAT14(in_stack_ffffffffffffff74,
                                             CONCAT13(in_stack_ffffffffffffff73,
                                                      CONCAT12(in_stack_ffffffffffffff72,
                                                               CONCAT11(in_stack_ffffffffffffff71,
                                                                        in_stack_ffffffffffffff70)))
                                            )))),
         (flexfloat_t *)
         CONCAT17(in_stack_ffffffffffffff6f,
                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
         (flexfloat_t *)0x102273);
  ff_mul((flexfloat_t *)
         CONCAT17(in_stack_ffffffffffffff77,
                  CONCAT16(in_stack_ffffffffffffff76,
                           CONCAT15(in_stack_ffffffffffffff75,
                                    CONCAT14(in_stack_ffffffffffffff74,
                                             CONCAT13(in_stack_ffffffffffffff73,
                                                      CONCAT12(in_stack_ffffffffffffff72,
                                                               CONCAT11(in_stack_ffffffffffffff71,
                                                                        in_stack_ffffffffffffff70)))
                                            )))),
         (flexfloat_t *)
         CONCAT17(in_stack_ffffffffffffff6f,
                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
         (flexfloat_t *)0x102285);
  uVar5 = '\x05';
  uVar6 = '\n';
  ff_init_double((flexfloat_t *)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                 5.22447740932243e-318,(flexfloat_desc_t)0xa05);
  uVar3 = 5;
  uVar4 = 10;
  desc_01.frac_bits = uVar6;
  desc_01.exp_bits = uVar5;
  ff_init_double((flexfloat_t *)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                 5.22464045098556e-318,desc_01);
  uVar1 = 5;
  uVar2 = 10;
  ff_init(local_78,(flexfloat_desc_t)0xa05);
  ff_add((flexfloat_t *)
         CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(uVar2,CONCAT12(uVar1,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))),
         (flexfloat_t *)
         CONCAT17(in_stack_ffffffffffffff6f,
                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
         (flexfloat_t *)0x1022f4);
  ff_div((flexfloat_t *)
         CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(uVar2,CONCAT12(uVar1,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))),
         (flexfloat_t *)
         CONCAT17(in_stack_ffffffffffffff6f,
                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
         (flexfloat_t *)0x102308);
  desc_02.frac_bits = uVar6;
  desc_02.exp_bits = uVar5;
  ff_cast((flexfloat_t *)
          CONCAT17(in_stack_ffffffffffffff6f,
                   CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
          (flexfloat_t *)0x102326,desc_02);
  desc_03.frac_bits = uVar6;
  desc_03.exp_bits = uVar5;
  ff_cast((flexfloat_t *)CONCAT17(7,CONCAT16(8,in_stack_ffffffffffffff68)),(flexfloat_t *)0x102344,
          desc_03);
  return 0;
}

Assistant:

int main(){

    double dbl;

    #ifdef FLEXFLOAT_STATS
    ff_start_stats();
    #else
    printf("WARNING: Collection of statistics is not enabled by default, execute \"cd <build_dir> && cmake -DENABLE_STATS=ON <src_dir> && make\"\n");
    #endif
    // Double-precision variables
    flexfloat_t ff_a, ff_b, ff_c;
    ff_init_double(&ff_a, 10.4, (flexfloat_desc_t) {11, 52});
    ff_init_double(&ff_b, 11.5, (flexfloat_desc_t) {11, 52});
    ff_init(&ff_c, (flexfloat_desc_t) {11, 52});

    // Arithmetic operators
    ff_add(&ff_c, &ff_a, &ff_b); // c=a+b
    ff_add(&ff_c, &ff_c, &ff_b); // c=c+b
    ff_sub(&ff_c, &ff_c, &ff_b); // c=c-b
    ff_mul(&ff_c, &ff_c, &ff_a); // c=c*b

    // IEEE float16: 5 bits (exponent) + 10 bits (explicit mantissa)
    flexfloat_t n1, n2, n3, n4;
    ff_init_double(&n1, 1.11, (flexfloat_desc_t) {5, 10});
    ff_init_double(&n2, 3.754, (flexfloat_desc_t) {5, 10});
    ff_init(&n3, (flexfloat_desc_t) {5, 10});
    ff_add(&n3, &n1, &n2);
    ff_div(&n3, &n1, &n2);

    // Casts
    ff_cast(&n3, &ff_c, (flexfloat_desc_t) {5, 10}); //  n3 = ff_c;
    ff_cast(&n4, &n3, (flexfloat_desc_t) {8, 7}); // n4 = n3

    #ifdef FLEXFLOAT_STATS
    ff_print_stats();
    #endif

    return 0;
}